

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,int v)

{
  _formatInteger<int>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(int v)
{
	_formatInteger(v);
	return *this;
}